

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsValidTest::prepareUniforms
          (ImplicitConversionsValidTest *this,program *program)

{
  TestError *this_00;
  GLuint GVar1;
  TYPES type;
  GLuint GVar2;
  pointer ptVar3;
  GLuint *data;
  
  ptVar3 = &this->m_debug_test_case;
  if ((ulong)this->m_current_test_case_index != 0xffffffff) {
    ptVar3 = (this->m_test_cases).
             super__Vector_base<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase,_std::allocator<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_start + this->m_current_test_case_index;
  }
  switch((ptVar3->m_types).m_t2) {
  case FLOAT:
    Utils::program::uniform
              (program,"uni_left",FLOAT,ptVar3->m_n_cols,ptVar3->m_n_rows,
               prepareUniforms::float_data);
    GVar1 = ptVar3->m_n_cols;
    GVar2 = ptVar3->m_n_rows;
    type = FLOAT;
    data = (GLuint *)prepareUniforms::float_data;
    goto LAB_00a64f74;
  case DOUBLE:
    GVar1 = ptVar3->m_n_cols;
    GVar2 = ptVar3->m_n_rows;
    type = DOUBLE;
    data = (GLuint *)prepareUniforms::double_data;
    break;
  case INT:
    GVar1 = ptVar3->m_n_cols;
    GVar2 = ptVar3->m_n_rows;
    type = INT;
    data = (GLuint *)prepareUniforms::int_data;
    break;
  case UINT:
    GVar1 = ptVar3->m_n_cols;
    GVar2 = ptVar3->m_n_rows;
    data = prepareUniforms::uint_data;
    type = UINT;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x11d1);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  Utils::program::uniform(program,"uni_left",type,GVar1,GVar2,data);
  GVar1 = ptVar3->m_n_cols;
  GVar2 = ptVar3->m_n_rows;
LAB_00a64f74:
  Utils::program::uniform(program,"uni_right",type,GVar1,GVar2,data);
  return;
}

Assistant:

void ImplicitConversionsValidTest::prepareUniforms(Utils::program& program)
{
	static const GLdouble double_data[16] = { 1.0, 1.0, 1.0, 1.0, 1.0, 1.0, 1.0, 1.0,
											  1.0, 1.0, 1.0, 1.0, 1.0, 1.0, 1.0, 1.0 };
	static const GLfloat float_data[16] = { 1.0f, 1.0f, 1.0f, 1.0f, 1.0f, 1.0f, 1.0f, 1.0f,
											1.0f, 1.0f, 1.0f, 1.0f, 1.0f, 1.0f, 1.0f, 1.0f };
	static const GLint  int_data[4]  = { 1, 1, 1, 1 };
	static const GLuint uint_data[4] = { 1u, 1u, 1u, 1u };

	const testCase& test_case = getCurrentTestCase();

	switch (test_case.m_types.m_t2)
	{
	case Utils::DOUBLE:
		program.uniform("uni_left", Utils::DOUBLE, test_case.m_n_cols, test_case.m_n_rows, double_data);
		program.uniform("uni_right", Utils::DOUBLE, test_case.m_n_cols, test_case.m_n_rows, double_data);
		break;
	case Utils::FLOAT:
		program.uniform("uni_left", Utils::FLOAT, test_case.m_n_cols, test_case.m_n_rows, float_data);
		program.uniform("uni_right", Utils::FLOAT, test_case.m_n_cols, test_case.m_n_rows, float_data);
		break;
	case Utils::INT:
		program.uniform("uni_left", Utils::INT, test_case.m_n_cols, test_case.m_n_rows, int_data);
		program.uniform("uni_right", Utils::INT, test_case.m_n_cols, test_case.m_n_rows, int_data);
		break;
	case Utils::UINT:
		program.uniform("uni_left", Utils::UINT, test_case.m_n_cols, test_case.m_n_rows, uint_data);
		program.uniform("uni_right", Utils::UINT, test_case.m_n_cols, test_case.m_n_rows, uint_data);
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}